

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O0

void __thiscall mocker::LoopInvariantCodeMotion::insertPreHeaders(LoopInvariantCodeMotion *this)

{
  size_t sVar1;
  reference pBVar2;
  bool bVar3;
  unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  size_type sVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  InstList *pIVar7;
  reference v;
  pair<unsigned_long,_unsigned_long> pVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>,_bool>
  pVar9;
  shared_ptr<mocker::ir::Label> local_200;
  shared_ptr<mocker::ir::Jump> local_1f0;
  shared_ptr<mocker::ir::IRInst> local_1e0;
  shared_ptr<mocker::ir::IRInst> local_1d0;
  undefined1 local_1c0 [8];
  pair<std::shared_ptr<mocker::ir::Phi>,_std::shared_ptr<mocker::ir::Phi>_> newPhis;
  shared_ptr<mocker::ir::Phi> phi;
  shared_ptr<mocker::ir::IRInst> *inst;
  iterator __end2_1;
  iterator __begin2_1;
  InstList *__range2_1;
  shared_ptr<mocker::ir::IRInst> *local_160;
  value_type *terminator;
  BasicBlock *bb;
  unsigned_long *pred;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range2;
  pair<unsigned_long,_unsigned_long> local_120;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_110;
  byte local_108;
  byte local_f9;
  size_t sStack_f8;
  bool tmp;
  size_t preHeader;
  reference local_e8;
  BasicBlock *preHeaderBB;
  BasicBlock *headBB;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d0;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c8;
  undefined1 local_c0 [8];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  outerPreds;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *loopNodes;
  unsigned_long header;
  value_type *kv;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  *__range1;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  Preds;
  LoopInvariantCodeMotion *this_local;
  
  Preds._M_h._M_single_bucket = (__node_base_ptr)this;
  buildBlockPredecessors
            ((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)&__range1,(this->super_FuncPass).func);
  this_00 = LoopInfo::getLoops(&this->loopTree);
  __end1 = std::
           unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
           ::begin(this_00);
  kv = (value_type *)
       std::
       unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
       ::end(this_00);
  do {
    bVar3 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false>
                         *)&kv);
    if (!bVar3) {
      removeDeletedInsts((this->super_FuncPass).func);
      std::
      unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~unordered_map((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)&__range1);
      return;
    }
    header = (unsigned_long)
             std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false,_false>
             ::operator*(&__end1);
    loopNodes = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)((reference)header)->first;
    outerPreds._M_h._M_single_bucket = (__node_base_ptr)&((reference)header)->second;
    sVar4 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)outerPreds._M_h._M_single_bucket);
    if (sVar4 != 1) {
      pmVar5 = std::
               unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::at((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     *)&__range1,(key_type *)&loopNodes);
      local_c8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pmVar5);
      pmVar5 = std::
               unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::at((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                     *)&__range1,(key_type *)&loopNodes);
      local_d0._M_current =
           (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pmVar5);
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&headBB + 5));
      std::
      unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
      ::
      unordered_set<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
                  *)local_c0,local_c8,local_d0,0,(hasher *)((long)&headBB + 7),
                 (key_equal *)((long)&headBB + 6),(allocator<unsigned_long> *)((long)&headBB + 5));
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&headBB + 5));
      subSet<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
                ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)local_c0,
                 (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)outerPreds._M_h._M_single_bucket);
      sVar1 = *(size_t *)header;
      sVar6 = ir::FunctionModule::getFirstBBLabel((this->super_FuncPass).func);
      if (sVar1 == sVar6) {
        headBB._0_4_ = 3;
      }
      else {
        bVar3 = std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)local_c0);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          __assert_fail("!outerPreds.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp"
                        ,0x3c,"void mocker::LoopInvariantCodeMotion::insertPreHeaders()");
        }
        preHeaderBB = ir::FunctionModule::getMutableBasicBlock
                                ((this->super_FuncPass).func,(size_t)loopNodes);
        preHeader = (size_t)ir::FunctionModule::pushBackBB((this->super_FuncPass).func);
        local_e8 = std::_List_iterator<mocker::ir::BasicBlock>::operator*
                             ((_List_iterator<mocker::ir::BasicBlock> *)&preHeader);
        sStack_f8 = ir::BasicBlock::getLabelID(local_e8);
        pVar8 = std::make_pair<unsigned_long&,unsigned_long&>
                          ((unsigned_long *)&loopNodes,&stack0xffffffffffffff08);
        local_120 = pVar8;
        pVar9 = std::
                unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                ::emplace<std::pair<unsigned_long,unsigned_long>>
                          ((unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                            *)&this->preHeaders,&local_120);
        local_110._M_cur =
             (__node_type *)
             pVar9.first.
             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur;
        local_108 = pVar9.second;
        local_f9 = local_108 & 1;
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __assert_fail("tmp",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp"
                        ,0x43,"void mocker::LoopInvariantCodeMotion::insertPreHeaders()");
        }
        __end2 = std::
                 unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::begin((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)local_c0);
        pred = (unsigned_long *)
               std::
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::end((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)local_c0);
        while( true ) {
          bVar3 = std::__detail::operator!=
                            (&__end2.super__Node_iterator_base<unsigned_long,_false>,
                             (_Node_iterator_base<unsigned_long,_false> *)&pred);
          if (!bVar3) break;
          bb = (BasicBlock *)
               std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*(&__end2);
          terminator = (value_type *)
                       ir::FunctionModule::getMutableBasicBlock
                                 ((this->super_FuncPass).func,bb->labelID);
          pIVar7 = ir::BasicBlock::getMutableInsts_abi_cxx11_((BasicBlock *)terminator);
          local_160 = std::__cxx11::
                      list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                      ::back(pIVar7);
          replaceTerminatorLabel((mocker *)&__range2_1,local_160,(size_t)loopNodes,sStack_f8);
          std::shared_ptr<mocker::ir::IRInst>::operator=
                    (local_160,(shared_ptr<mocker::ir::IRInst> *)&__range2_1);
          std::shared_ptr<mocker::ir::IRInst>::~shared_ptr
                    ((shared_ptr<mocker::ir::IRInst> *)&__range2_1);
          std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++(&__end2);
        }
        pIVar7 = ir::BasicBlock::getMutableInsts_abi_cxx11_(preHeaderBB);
        __end2_1 = std::__cxx11::
                   list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                   ::begin(pIVar7);
        inst = (shared_ptr<mocker::ir::IRInst> *)
               std::__cxx11::
               list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
               ::end(pIVar7);
        while( true ) {
          bVar3 = std::operator!=(&__end2_1,(_Self *)&inst);
          if (!bVar3) break;
          v = std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2_1);
          ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>
                    ((ir *)&newPhis.second.
                            super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,v);
          bVar3 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr *)
                             &newPhis.second.
                              super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          if (bVar3) {
            anon_unknown_8::splitPhi
                      ((pair<std::shared_ptr<mocker::ir::Phi>,_std::shared_ptr<mocker::ir::Phi>_> *)
                       local_1c0,(this->super_FuncPass).func,
                       (shared_ptr<mocker::ir::Phi> *)
                       &newPhis.second.
                        super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)local_c0,sStack_f8);
            bVar3 = std::__shared_ptr::operator_cast_to_bool
                              ((__shared_ptr *)
                               &newPhis.first.
                                super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
            pBVar2 = local_e8;
            if (bVar3) {
              std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Phi,void>
                        (&local_1d0,
                         (shared_ptr<mocker::ir::Phi> *)
                         &newPhis.first.
                          super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              ir::BasicBlock::appendInst(pBVar2,&local_1d0);
              std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_1d0);
              std::shared_ptr<mocker::ir::IRInst>::operator=
                        (v,(shared_ptr<mocker::ir::Phi> *)local_1c0);
            }
            std::pair<std::shared_ptr<mocker::ir::Phi>,_std::shared_ptr<mocker::ir::Phi>_>::~pair
                      ((pair<std::shared_ptr<mocker::ir::Phi>,_std::shared_ptr<mocker::ir::Phi>_> *)
                       local_1c0);
            headBB._0_4_ = 0;
          }
          else {
            headBB._0_4_ = 6;
          }
          std::shared_ptr<mocker::ir::Phi>::~shared_ptr
                    ((shared_ptr<mocker::ir::Phi> *)
                     &newPhis.second.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          if ((int)headBB != 0) break;
          std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2_1);
        }
        pBVar2 = local_e8;
        std::make_shared<mocker::ir::Label,unsigned_long&>((unsigned_long *)&local_200);
        std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>>
                  ((shared_ptr<mocker::ir::Label> *)&local_1f0);
        std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Jump,void>
                  (&local_1e0,&local_1f0);
        ir::BasicBlock::appendInst(pBVar2,&local_1e0);
        std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_1e0);
        std::shared_ptr<mocker::ir::Jump>::~shared_ptr(&local_1f0);
        std::shared_ptr<mocker::ir::Label>::~shared_ptr(&local_200);
        simplifyPhiFunctions(preHeaderBB);
        simplifyPhiFunctions(local_e8);
        headBB._0_4_ = 0;
      }
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)local_c0);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_false,_false>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void LoopInvariantCodeMotion::insertPreHeaders() {
  const auto Preds = buildBlockPredecessors(func);

  for (auto &kv : loopTree.getLoops()) {
    auto header = kv.first;
    auto &loopNodes = kv.second;
    if (loopNodes.size() == 1) // is not a loop header
      continue;
    std::unordered_set<std::size_t> outerPreds(Preds.at(header).begin(),
                                               Preds.at(header).end());
    subSet(outerPreds, loopNodes);

    if (kv.first == func.getFirstBBLabel())
      continue;

    assert(!outerPreds.empty());

    // Insert a pre-header. Be careful with the phi-functions
    auto &headBB = func.getMutableBasicBlock(header);
    auto &preHeaderBB = *func.pushBackBB();
    auto preHeader = preHeaderBB.getLabelID();
    auto tmp = preHeaders.emplace(std::make_pair(header, preHeader)).second;
    assert(tmp);

    // adjust the terminators of the outer predecessors
    for (auto &pred : outerPreds) {
      auto &bb = func.getMutableBasicBlock(pred);
      auto &terminator = bb.getMutableInsts().back();
      terminator = replaceTerminatorLabel(terminator, header, preHeader);
    }

    // adjust the phi-functions
    for (auto &inst : headBB.getMutableInsts()) {
      const auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        break;
      auto newPhis = splitPhi(func, phi, outerPreds, preHeader);
      if (newPhis.second) {
        preHeaderBB.appendInst(newPhis.second);
        inst = newPhis.first;
      }
    }
    preHeaderBB.appendInst(
        std::make_shared<ir::Jump>(std::make_shared<ir::Label>(header)));
    simplifyPhiFunctions(headBB);
    simplifyPhiFunctions(preHeaderBB);
  }
  removeDeletedInsts(func);
}